

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddConfidentialTxOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string,char *nonce)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  int64_t in_RDX;
  ConfidentialTransactionContext *in_RSI;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  Address addr;
  ElementsConfidentialAddress confidential_addr;
  ElementsAddressFactory address_factory;
  ConfidentialNonce nonce_obj;
  ConfidentialAssetId asset;
  ConfidentialTransactionContext *tx;
  Amount amount;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  ElementsConfidentialAddress *in_stack_fffffffffffff8c0;
  AddressFactory *in_stack_fffffffffffff8c8;
  pointer pCVar3;
  string *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  CfdError error_code;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  ElementsAddressFactory *in_stack_fffffffffffff8f0;
  bool *in_stack_fffffffffffff918;
  char *pcVar5;
  undefined8 in_stack_fffffffffffff920;
  int network_type;
  ConfidentialAssetId *in_stack_fffffffffffff980;
  Amount *in_stack_fffffffffffff988;
  ConfidentialTransactionContext *this;
  allocator local_649;
  string local_648 [16];
  undefined8 in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  Script local_628;
  Script local_5f0;
  allocator local_5b1;
  string local_5b0 [32];
  Address local_590;
  allocator local_411;
  string local_410;
  ElementsConfidentialAddress local_3f0;
  allocator local_239;
  string local_238 [2];
  allocator local_1e9;
  string local_1e8;
  ConfidentialNonce local_1c8;
  ConfidentialNonce local_1a0;
  allocator local_171;
  string local_170;
  ConfidentialAssetId local_150;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  CfdSourceLocation local_100;
  pointer local_e8;
  Amount local_e0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [39];
  byte local_79;
  ConfidentialTransactionContext *local_78;
  allocator local_69;
  string local_68 [48];
  char *local_38;
  char *local_30;
  char *local_28;
  int64_t local_20;
  ConfidentialTransactionContext *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  network_type = (int)((ulong)in_stack_fffffffffffff920 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer((void *)in_stack_fffffffffffff9d0,(string *)in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  local_79 = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffff918);
  if ((local_78->super_ConfidentialTransaction).vin_.
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Invalid handle state. tx is null",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               error_code,in_stack_fffffffffffff8d0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_79 & 1) == 0) {
    cfd::core::Amount::Amount(&local_e0,local_20);
    local_e8 = (local_78->super_ConfidentialTransaction).vin_.
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar1 = cfd::capi::IsEmptyString(local_38);
    if (bVar1) {
      local_100.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_100.filename = local_100.filename + 1;
      local_100.line = 0xa90;
      local_100.funcname = "CfdAddConfidentialTxOutput";
      cfd::core::logger::warn<>(&local_100,"asset is null or empty.");
      local_122 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_120,"Failed to parameter. asset is null or empty.",&local_121);
      cfd::core::CfdException::CfdException
                ((CfdException *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 error_code,in_stack_fffffffffffff8d0);
      local_122 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,local_38,&local_171);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_150,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    cfd::core::ConfidentialNonce::ConfidentialNonce(&local_1a0);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,in_stack_00000008,&local_1e9);
      cfd::core::ConfidentialNonce::ConfidentialNonce(&local_1c8,&local_1e8);
      cfd::core::ConfidentialNonce::operator=(&local_1a0,&local_1c8);
      cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5bea9b);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
    bVar1 = cfd::capi::IsEmptyString(local_28);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(local_30);
      if (bVar1) {
        cfd::ConfidentialTransactionContext::UpdateFeeAmount
                  (this,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
      }
      else {
        paVar4 = &local_649;
        pCVar3 = local_e8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_648,local_30,paVar4);
        cfd::core::Script::Script(&local_628,(string *)local_648);
        cfd::core::ConfidentialTransaction::AddTxOut
                  ((ConfidentialTransaction *)pCVar3,&local_e0,&local_150,&local_628,&local_1a0);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff8c0);
        std::__cxx11::string::~string(local_648);
        std::allocator<char>::~allocator((allocator<char> *)&local_649);
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff8f0);
      paVar4 = &local_239;
      pcVar5 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_238,pcVar5,paVar4);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_238);
      std::__cxx11::string::~string((string *)local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_410,local_28,&local_411);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_3f0,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator((allocator<char> *)&local_411);
        (*(local_e8->super_AbstractTxIn)._vptr_AbstractTxIn[0x13])
                  (local_e8,&local_3f0,&local_e0,&local_150,0);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  (in_stack_fffffffffffff8c0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b0,local_28,&local_5b1);
        cfd::AddressFactory::GetAddress
                  (in_stack_fffffffffffff8c8,(string *)in_stack_fffffffffffff8c0);
        std::__cxx11::string::~string(local_5b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        pCVar3 = local_e8;
        cfd::core::Address::GetLockingScript(&local_5f0,&local_590);
        cfd::core::ConfidentialTransaction::AddTxOut
                  ((ConfidentialTransaction *)pCVar3,&local_e0,&local_150,&local_5f0,&local_1a0);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff8c0);
        cfd::core::Address::~Address(&in_stack_fffffffffffff8c0->unblinded_address_);
      }
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5bef20);
    }
    local_4 = 0;
    cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5bf0b0);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5bf0bd);
    return local_4;
  }
  local_ca = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Invalid handle state. tx is bitcoin.",&local_c9);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             error_code,in_stack_fffffffffffff8d0);
  local_ca = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string, const char* nonce) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }
    Amount amount = Amount(value_satoshi);

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }
    ConfidentialAssetId asset = ConfidentialAssetId(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }

    if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        tx->AddTxOut(confidential_addr, amount, asset, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        tx->AddTxOut(amount, asset, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce_obj);
    } else {
      tx->UpdateFeeAmount(amount, asset);
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}